

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O0

Int128 __thiscall btConvexHullInternal::Int128::operator*(Int128 *this,int64_t b)

{
  long in_RSI;
  undefined1 (*in_RDI) [16];
  bool bVar1;
  Int128 IVar2;
  Int128 result;
  Int128 a;
  bool negative;
  uint64_t in_stack_ffffffffffffffa8;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_30;
  long local_20;
  Int128 local_10;
  
  bVar1 = *(long *)(*in_RDI + 8) < 0;
  if (bVar1) {
    IVar2 = operator-((Int128 *)0x149d87);
    local_30 = IVar2.high;
  }
  else {
    local_30 = SUB168(*in_RDI,8);
  }
  local_20 = in_RSI;
  if (in_RSI < 0) {
    bVar1 = !bVar1;
    local_20 = -in_RSI;
  }
  IVar2 = mul((uint64_t)in_RDI,in_stack_ffffffffffffffa8);
  local_40 = IVar2.high;
  local_48 = IVar2.low;
  if (bVar1) {
    local_10 = operator-((Int128 *)0x149e08);
  }
  else {
    local_10.high = local_30 * local_20 + local_40;
    local_10.low = local_48;
  }
  return local_10;
}

Assistant:

btConvexHullInternal::Int128 btConvexHullInternal::Int128::operator*(int64_t b) const
{
	bool negative = (int64_t) high < 0;
	Int128 a = negative ? -*this : *this;
	if (b < 0)
	{
		negative = !negative;
		b = -b;
	}
	Int128 result = mul(a.low, (uint64_t) b);
	result.high += a.high * (uint64_t) b;
	return negative ? -result : result;
}